

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

void SUNBandMatrix_Print(SUNMatrix A,FILE *outfile)

{
  int iVar1;
  SUNMatrix_ID SVar2;
  FILE *in_RSI;
  long *in_RDI;
  sunindextype finish;
  sunindextype start;
  sunindextype j;
  sunindextype i;
  int local_28;
  int local_24;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_18;
  int local_14;
  
  SVar2 = SUNMatGetID((SUNMatrix)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (SVar2 == SUNMATRIX_BAND) {
    fprintf(in_RSI,"\n");
    for (local_14 = 0; local_14 < *(int *)*in_RDI; local_14 = local_14 + 1) {
      if (local_14 - *(int *)(*in_RDI + 0x10) < 0) {
        local_24 = 0;
      }
      else {
        local_24 = local_14 - *(int *)(*in_RDI + 0x10);
      }
      if (*(int *)(*in_RDI + 4) + -1 < local_14 + *(int *)(*in_RDI + 0xc)) {
        local_28 = *(int *)(*in_RDI + 4) + -1;
      }
      else {
        local_28 = local_14 + *(int *)(*in_RDI + 0xc);
      }
      for (local_18 = 0; iVar1 = local_24, local_18 < local_24; local_18 = local_18 + 1) {
        fprintf(in_RSI,"%12s  ","");
      }
      while (local_18 = iVar1, local_18 <= local_28) {
        fprintf(in_RSI,"%12g  ",
                *(undefined8 *)
                 (*(long *)(*(long *)(*in_RDI + 0x28) + (long)local_18 * 8) +
                 (long)((local_14 - local_18) + *(int *)(*in_RDI + 0x14)) * 8));
        iVar1 = local_18 + 1;
      }
      fprintf(in_RSI,"\n");
    }
    fprintf(in_RSI,"\n");
  }
  return;
}

Assistant:

void SUNBandMatrix_Print(SUNMatrix A, FILE* outfile)
{
  sunindextype i, j, start, finish;

  /* should not be called unless A is a band matrix;
     otherwise return immediately */
  if (SUNMatGetID(A) != SUNMATRIX_BAND)
    return;

  /* perform operation */
  fprintf(outfile,"\n");
  for (i=0; i<SM_ROWS_B(A); i++) {
    start = SUNMAX(0, i-SM_LBAND_B(A));
    finish = SUNMIN(SM_COLUMNS_B(A)-1, i+SM_UBAND_B(A));
    for (j=0; j<start; j++)
      fprintf(outfile,"%12s  ","");
    for (j=start; j<=finish; j++) {
#if defined(SUNDIALS_EXTENDED_PRECISION)
      fprintf(outfile,"%12Lg  ", SM_ELEMENT_B(A,i,j));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
      fprintf(outfile,"%12g  ", SM_ELEMENT_B(A,i,j));
#else
      fprintf(outfile,"%12g  ", SM_ELEMENT_B(A,i,j));
#endif
    }
    fprintf(outfile,"\n");
  }
  fprintf(outfile,"\n");
  return;
}